

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

buffer_appender<char>
fmt::v7::detail::write_nonfinite<char,fmt::v7::detail::buffer_appender<char>>
          (buffer_appender<char> out,bool isinf,basic_format_specs<char> *specs,float_specs *fspecs)

{
  buffer_appender<char> bVar1;
  char *pcVar2;
  undefined7 in_register_00000031;
  anon_class_16_2_632e021f local_10;
  
  pcVar2 = "INF";
  local_10.str = "NAN";
  if ((*(uint *)&fspecs->field_0x4 >> 0x10 & 1) == 0) {
    pcVar2 = "inf";
    local_10.str = "nan";
  }
  if ((int)CONCAT71(in_register_00000031,isinf) != 0) {
    local_10.str = pcVar2;
  }
  local_10.sign = *(uint *)&fspecs->field_0x4 >> 8 & 0xff;
  bVar1 = write_padded<(fmt::v7::align::type)1,fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::write_nonfinite<char,fmt::v7::detail::buffer_appender<char>>(fmt::v7::detail::buffer_appender<char>,bool,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs_const&)::_lambda(fmt::v7::detail::buffer_appender<char>)_1_>
                    (out,specs,(ulong)(local_10.sign != none) + 3,&local_10);
  return (buffer_appender<char>)
         bVar1.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
}

Assistant:

OutputIt write_nonfinite(OutputIt out, bool isinf,
                         const basic_format_specs<Char>& specs,
                         const float_specs& fspecs) {
  auto str =
      isinf ? (fspecs.upper ? "INF" : "inf") : (fspecs.upper ? "NAN" : "nan");
  constexpr size_t str_size = 3;
  auto sign = fspecs.sign;
  auto size = str_size + (sign ? 1 : 0);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;
  return write_padded(out, specs, size, [=](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    return copy_str<Char>(str, str + str_size, it);
  });
}